

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O2

exr_result_t
internal_exr_compute_tile_information(exr_context_t ctxt,exr_priv_part_t curpart,int rebuild)

{
  int32_t *piVar1;
  int32_t *piVar2;
  byte bVar3;
  exr_attr_tiledesc_t *peVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  exr_result_t eVar8;
  int32_t *piVar9;
  ulong uVar10;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  long maxd;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long mind;
  long x;
  long maxd_00;
  long mind_00;
  long x_00;
  uint uVar14;
  exr_result_t eStackY_80;
  
  if ((curpart->storage_mode < (EXR_STORAGE_LAST_TYPE|EXR_STORAGE_DEEP_SCANLINE)) &&
     ((0x25U >> (curpart->storage_mode & 0x1f) & 1) != 0)) {
    return 0;
  }
  if ((ctxt->mode == '\x04') && (curpart->tiles == (exr_attribute_t *)0x0)) {
    return 0;
  }
  if (rebuild == 0) {
    if (curpart->tiles == (exr_attribute_t *)0x0) {
      UNRECOVERED_JUMPTABLE = ctxt->standard_error;
      eStackY_80 = 0xd;
      goto LAB_0011f786;
    }
    if (curpart->tile_level_tile_count_x != (int32_t *)0x0) {
      return 0;
    }
  }
  else {
    if (curpart->dataWindow == (exr_attribute_t *)0x0) {
      return 0;
    }
    if (curpart->tiles == (exr_attribute_t *)0x0) {
      return 0;
    }
    if (curpart->tile_level_tile_count_x != (int32_t *)0x0) {
      (*ctxt->free_fn)(curpart->tile_level_tile_count_x);
      curpart->tile_level_tile_count_x = (int32_t *)0x0;
    }
  }
  peVar4 = (curpart->tiles->field_6).tiledesc;
  if ((peVar4->x_size == 0) || (peVar4->y_size == 0)) {
LAB_0011f654:
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_80 = 0xe;
  }
  else {
    mind = (long)(curpart->data_window).min.x;
    mind_00 = (long)(curpart->data_window).min.y;
    maxd_00 = (long)(curpart->data_window).max.x;
    maxd = (long)(curpart->data_window).max.y;
    bVar3 = peVar4->level_and_round;
    if ((bVar3 & 0xf) == 0) {
      uVar14 = 1;
      uVar5 = uVar14;
    }
    else {
      x = (maxd_00 - mind) + 1;
      x_00 = (maxd - mind_00) + 1;
      if ((bVar3 & 0xf) == 2) {
        if (bVar3 < 0x10) {
          iVar6 = floor_log2(x);
          iVar7 = floor_log2(x_00);
        }
        else {
          iVar6 = ceil_log2(x);
          iVar7 = ceil_log2(x_00);
        }
        uVar14 = iVar6 + 1;
        uVar5 = iVar7 + 1;
      }
      else {
        if ((bVar3 & 0xf) != 1) goto LAB_0011f654;
        if (x_00 < x) {
          x_00 = x;
        }
        if (bVar3 < 0x10) {
          iVar6 = floor_log2(x_00);
        }
        else {
          iVar6 = ceil_log2(x_00);
        }
        uVar14 = iVar6 + 1;
        uVar5 = uVar14;
      }
    }
    curpart->num_tile_levels_x = uVar14;
    curpart->num_tile_levels_y = uVar5;
    piVar9 = (int32_t *)(*ctxt->alloc_fn)((long)(int)(uVar14 + uVar5) << 3);
    if (piVar9 != (int32_t *)0x0) {
      piVar1 = piVar9 + (int)uVar14;
      piVar2 = piVar1 + (int)uVar14;
      uVar12 = 0;
      uVar13 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar13 = uVar12;
      }
      do {
        if (uVar13 == uVar12) {
          uVar12 = 0;
          uVar13 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            uVar13 = uVar12;
          }
          while( true ) {
            if (uVar13 == uVar12) {
              curpart->tile_level_tile_count_x = piVar9;
              curpart->tile_level_tile_count_y = piVar2;
              curpart->tile_level_tile_size_x = piVar1;
              curpart->tile_level_tile_size_y = piVar2 + (int)uVar5;
              return 0;
            }
            iVar6 = (int)uVar12;
            uVar10 = calc_level_size(mind_00,maxd,iVar6,(uint)(peVar4->level_and_round >> 4));
            if (0x7fffffff < uVar10) break;
            piVar2[uVar12] = (int32_t)(((uVar10 + peVar4->y_size) - 1) / (ulong)peVar4->y_size);
            (piVar2 + (int)uVar5)[uVar12] = (int32_t)uVar10;
            uVar12 = uVar12 + 1;
          }
          pcVar11 = 
          "Invalid data window y dims (%d, %d) resulting in invalid tile level size (%ld) for level %d"
          ;
LAB_0011f862:
          eVar8 = (*ctxt->print_error)(ctxt,0xe,pcVar11,mind_00,maxd,uVar10,iVar6);
          return eVar8;
        }
        iVar6 = (int)uVar12;
        uVar10 = calc_level_size(mind,maxd_00,iVar6,(uint)(peVar4->level_and_round >> 4));
        if (0x7fffffff < uVar10) {
          pcVar11 = 
          "Invalid data window x dims (%d, %d) resulting in invalid tile level size (%ld) for level %d"
          ;
          mind_00 = mind;
          maxd = maxd_00;
          goto LAB_0011f862;
        }
        piVar9[uVar12] = (int32_t)(((uVar10 + peVar4->x_size) - 1) / (ulong)peVar4->x_size);
        piVar1[uVar12] = (int32_t)uVar10;
        uVar12 = uVar12 + 1;
      } while( true );
    }
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_80 = 1;
  }
LAB_0011f786:
  eVar8 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStackY_80);
  return eVar8;
}

Assistant:

exr_result_t
internal_exr_compute_tile_information (
    exr_context_t ctxt, exr_priv_part_t curpart, int rebuild)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    if (curpart->storage_mode == EXR_STORAGE_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_UNKNOWN)
        return EXR_ERR_SUCCESS;

    if (ctxt->mode == EXR_CONTEXT_TEMPORARY && !curpart->tiles)
        return EXR_ERR_SUCCESS;

    if (rebuild && (!curpart->dataWindow || !curpart->tiles))
        return EXR_ERR_SUCCESS;

    if (!curpart->tiles)
        return ctxt->standard_error (ctxt, EXR_ERR_MISSING_REQ_ATTR);

    if (rebuild)
    {
        if (curpart->tile_level_tile_count_x)
        {
            ctxt->free_fn (curpart->tile_level_tile_count_x);
            curpart->tile_level_tile_count_x = NULL;
        }
    }

    if (curpart->tile_level_tile_count_x == NULL)
    {
        const exr_attr_box2i_t     dw       = curpart->data_window;
        const exr_attr_tiledesc_t* tiledesc = curpart->tiles->tiledesc;
        int64_t                    w, h;
        int32_t                    numX, numY;
        int32_t*                   levcntX = NULL;
        int32_t*                   levcntY = NULL;
        int32_t*                   levszX  = NULL;
        int32_t*                   levszY  = NULL;

        w = ((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1;
        h = ((int64_t) dw.max.y) - ((int64_t) dw.min.y) + 1;

        if (tiledesc->x_size == 0 || tiledesc->y_size == 0)
            return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR);
        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL: numX = numY = 1; break;
            case EXR_TILE_MIPMAP_LEVELS:
                if (EXR_GET_TILE_ROUND_MODE ((*tiledesc)) ==
                    EXR_TILE_ROUND_DOWN)
                {
                    numX = floor_log2 (w > h ? w : h) + 1;
                    numY = numX;
                }
                else
                {
                    numX = ceil_log2 (w > h ? w : h) + 1;
                    numY = numX;
                }
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                if (EXR_GET_TILE_ROUND_MODE ((*tiledesc)) ==
                    EXR_TILE_ROUND_DOWN)
                {
                    numX = floor_log2 (w) + 1;
                    numY = floor_log2 (h) + 1;
                }
                else
                {
                    numX = ceil_log2 (w) + 1;
                    numY = ceil_log2 (h) + 1;
                }
                break;
            case EXR_TILE_LAST_TYPE:
            default: return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR);
        }

        curpart->num_tile_levels_x = numX;
        curpart->num_tile_levels_y = numY;
        levcntX                    = (int32_t*) ctxt->alloc_fn (
            2 * (size_t) (numX + numY) * sizeof (int32_t));
        if (levcntX == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        levszX  = levcntX + numX;
        levcntY = levszX + numX;
        levszY  = levcntY + numY;

        for (int32_t l = 0; l < numX; ++l)
        {
            int64_t sx = calc_level_size (
                dw.min.x, dw.max.x, l, EXR_GET_TILE_ROUND_MODE ((*tiledesc)));
            if (sx < 0 || sx > (int64_t) INT32_MAX)
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ATTR,
                    "Invalid data window x dims (%d, %d) resulting in invalid tile level size (%" PRId64
                    ") for level %d",
                    dw.min.x,
                    dw.max.x,
                    sx,
                    l);
            levcntX[l] = (int32_t) (((uint64_t) sx + tiledesc->x_size - 1) /
                                    tiledesc->x_size);
            levszX[l]  = (int32_t) sx;
        }

        for (int32_t l = 0; l < numY; ++l)
        {
            int64_t sy = calc_level_size (
                dw.min.y, dw.max.y, l, EXR_GET_TILE_ROUND_MODE ((*tiledesc)));
            if (sy < 0 || sy > (int64_t) INT32_MAX)
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ATTR,
                    "Invalid data window y dims (%d, %d) resulting in invalid tile level size (%" PRId64
                    ") for level %d",
                    dw.min.y,
                    dw.max.y,
                    sy,
                    l);
            levcntY[l] = (int32_t) (((uint64_t) sy + tiledesc->y_size - 1) /
                                    tiledesc->y_size);
            levszY[l]  = (int32_t) sy;
        }

        curpart->tile_level_tile_count_x = levcntX;
        curpart->tile_level_tile_count_y = levcntY;
        curpart->tile_level_tile_size_x  = levszX;
        curpart->tile_level_tile_size_y  = levszY;
    }
    return rv;
}